

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O0

void __thiscall
SplitCompilationTest_empty_Test<char>::TestBody(SplitCompilationTest_empty_Test<char> *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  AssertHelper local_78 [8];
  Message local_70 [31];
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_result;
  undefined1 local_20 [7];
  char delim;
  basic_string_view<char,_std::char_traits<char>_> empty;
  SplitCompilationTest_empty_Test<char> *this_local;
  
  empty._M_str = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  split_result.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  jessilib::split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_char>
            ((container_type_conflict13 *)&gtest_ar_.message_,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,
             (char *)((long)&split_result.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_51 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_98,local_50,"split_result.empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_98);
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=(local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty) {
	// string_view w/ short delimiter
	std::basic_string_view<TypeParam> empty;
	auto delim = default_delim<TypeParam>;
	std::vector<decltype(empty)> split_result = split_view(empty, delim);
	EXPECT_TRUE(split_result.empty());
}